

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-exceptions.hpp
# Opt level: O2

void __thiscall helics::HelicsSystemFailure::~HelicsSystemFailure(HelicsSystemFailure *this)

{
  HelicsException::~HelicsException(&this->super_HelicsException);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit HelicsSystemFailure(std::string_view message = "HELICS system failure") noexcept:
        HelicsException(message)
    {
    }